

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  byte *pbVar1;
  sqlite3 *psVar2;
  sqlite3_module *psVar3;
  int iVar4;
  Table *pTVar5;
  HashElem *pHVar6;
  Module *pMod;
  long lVar7;
  char *pcVar8;
  uchar uVar9;
  uchar uVar10;
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = pParse->db;
  if (((psVar2->mDbFlags & 0x10) == 0) && (iVar4 = sqlite3ReadSchema(pParse), iVar4 != 0)) {
LAB_0012794e:
    pTVar5 = (Table *)0x0;
  }
  else {
    pTVar5 = sqlite3FindTable(psVar2,zName,zDbase);
    if (pTVar5 == (Table *)0x0) {
      if (((pParse->prepFlags & 4) == 0) && ((psVar2->init).busy == '\0')) {
        pHVar6 = findElementWithHash(&psVar2->aModule,zName,(uint *)0x0);
        pMod = (Module *)pHVar6->data;
        if (pMod == (Module *)0x0) {
          if (zName != (char *)0x0) {
            lVar7 = 0;
            do {
              if ((ulong)(byte)zName[lVar7] == 0) {
                uVar10 = ""[(byte)"pragma_"[lVar7]];
                uVar9 = '\0';
LAB_00127b45:
                if (uVar9 != uVar10) goto LAB_0012790d;
                break;
              }
              uVar9 = ""[(byte)zName[lVar7]];
              uVar10 = ""[(byte)"pragma_"[lVar7]];
              if (uVar9 != uVar10) goto LAB_00127b45;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 7);
            pMod = sqlite3PragmaVtabRegister(psVar2,zName);
            if (pMod != (Module *)0x0) goto LAB_001279aa;
          }
        }
        else {
LAB_001279aa:
          psVar3 = pMod->pModule;
          local_40 = (char *)0x0;
          if (pMod->pEpoTab != (Table *)0x0) {
LAB_001279bf:
            pTVar5 = pMod->pEpoTab;
            goto LAB_00127951;
          }
          psVar2 = pParse->db;
          if (((psVar3->xCreate ==
                (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *
                )0x0) || (psVar3->xCreate == psVar3->xConnect)) &&
             (pTVar5 = (Table *)sqlite3DbMallocZero(psVar2,0x68), pTVar5 != (Table *)0x0)) {
            pcVar8 = sqlite3DbStrDup(psVar2,pMod->zName);
            pTVar5->zName = pcVar8;
            if (pcVar8 != (char *)0x0) {
              pMod->pEpoTab = pTVar5;
              pTVar5->nTabRef = 1;
              pTVar5->eTabType = '\x01';
              pTVar5->pSchema = psVar2->aDb->pSchema;
              pTVar5->iPKey = -1;
              pbVar1 = (byte *)((long)&pTVar5->tabFlags + 1);
              *pbVar1 = *pbVar1 | 0x80;
              pcVar8 = sqlite3DbStrDup(psVar2,pcVar8);
              addModuleArgument(pParse,pTVar5,pcVar8);
              addModuleArgument(pParse,pTVar5,(char *)0x0);
              pcVar8 = sqlite3DbStrDup(psVar2,pTVar5->zName);
              addModuleArgument(pParse,pTVar5,pcVar8);
              iVar4 = vtabCallConstructor(psVar2,pTVar5,pMod,psVar3->xConnect,&local_40);
              pcVar8 = local_40;
              if (iVar4 != 0) {
                sqlite3ErrorMsg(pParse,"%s",local_40);
                if (pcVar8 != (char *)0x0) {
                  sqlite3DbFreeNN(psVar2,pcVar8);
                }
                sqlite3VtabEponymousTableClear(psVar2,pMod);
              }
              goto LAB_001279bf;
            }
            sqlite3DbFreeNN(psVar2,pTVar5);
          }
        }
      }
LAB_0012790d:
      if ((flags & 2) != 0) goto LAB_0012794e;
      pParse->checkSchema = '\x01';
    }
    else if ((pTVar5->eTabType != '\x01') || ((pParse->prepFlags & 4) == 0)) goto LAB_00127951;
    pcVar8 = "no such view";
    if ((flags & 1) == 0) {
      pcVar8 = "no such table";
    }
    if (zDbase == (char *)0x0) {
      pTVar5 = (Table *)0x0;
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar8,zName);
    }
    else {
      pTVar5 = (Table *)0x0;
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar8,zDbase,zName);
    }
  }
LAB_00127951:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pTVar5;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)==0 && db->init.busy==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        testcase( pMod->pEpoTab==0 );
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)!=0 ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }else{
    assert( HasRowid(p) || p->iPKey<0 );
  }

  return p;
}